

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O3

void __thiscall pstack::Procman::Process::processAUXV(Process *this,Reader *auxio)

{
  uint64_t uVar1;
  Addr load;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar3;
  element_type *peVar4;
  value_type *pvVar5;
  ostream *poVar6;
  char *__s;
  size_t sVar7;
  size_t idx;
  string_view name;
  ReaderArray<Elf64_auxv_t,_64UL> local_4b8;
  shared_ptr<const_pstack::Reader> local_90;
  Context *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_78;
  Process *local_70;
  size_type *local_68;
  string exeName;
  shared_ptr<pstack::Elf::Object> elf;
  
  ReaderArray<Elf64_auxv_t,_64UL>::ReaderArray(&local_4b8,auxio,0);
  if (local_4b8.eof != 0) {
    local_78 = &(this->vdsoImage).
                super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    idx = 0;
    local_70 = this;
    do {
      pvVar5 = ReaderArray<Elf64_auxv_t,_64UL>::getitem(&local_4b8,idx);
      uVar1 = pvVar5->a_type;
      load = (pvVar5->a_un).a_val;
      if ((long)uVar1 < 0x1f) {
        if (uVar1 == 7) {
          if (2 < *(int *)(this->context + 0xa0)) {
            poVar6 = *(ostream **)(this->context + 0x78);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auxv: AT_BASE=",0xe);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          this->interpBase = load;
        }
        else if (uVar1 == 9) {
          if (2 < *(int *)(this->context + 0xa0)) {
            poVar6 = *(ostream **)(this->context + 0x78);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auxv: AT_ENTRY=",0xf);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          this->entry = load;
        }
        else {
          if (uVar1 == 0) {
            return;
          }
LAB_0012534e:
          if (2 < *(int *)(this->context + 0xa0)) {
            poVar6 = *(ostream **)(this->context + 0x78);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auxv: ",6);
            __s = auxtype2str((int)pvVar5->a_type);
            sVar7 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
        }
      }
      else if (uVar1 == 0x1f) {
        if (2 < *(int *)(this->context + 0xa0)) {
          poVar6 = *(ostream **)(this->context + 0x78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auxv: AT_EXECFN=",0x10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        peVar2 = (this->io).super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (**(code **)(*(long *)peVar2 + 0x38))(&local_68,peVar2,load);
        if (1 < *(int *)(this->context + 0xa0)) {
          poVar6 = *(ostream **)(this->context + 0x78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"filename from auxv: ",0x14);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)local_68,(long)exeName._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        }
        if ((this->execImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0) {
          pstack::Context::getImageForName
                    ((string *)(exeName.field_2._M_local_buf + 8),SUB81(this->context,0));
          peVar4 = elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar3 = exeName.field_2._8_8_;
          exeName.field_2._8_8_ = 0;
          elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          this_00 = (this->execImage).
                    super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          (this->execImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)uVar3;
          (this->execImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4;
          if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
             elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
          if (this->entry == 0) {
            this->entry = *(Addr *)((this->execImage).
                                    super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 0x90);
          }
        }
        if (local_68 != &exeName._M_string_length) {
          operator_delete(local_68,exeName._M_string_length + 1);
        }
      }
      else if (uVar1 == 0x20) {
        if (2 < *(int *)(this->context + 0xa0)) {
          poVar6 = *(ostream **)(this->context + 0x78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auxv:AT_SYSINFO=",0x10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        this->sysent = load;
      }
      else {
        if (uVar1 != 0x21) goto LAB_0012534e;
        local_80 = this->context;
        peVar2 = (this->io).super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_68 = &exeName._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"(vdso image)","");
        (**(code **)(*(long *)peVar2 + 0x48))(&local_90,peVar2,(string *)&local_68,load,0x10000);
        this = local_70;
        std::__shared_ptr<pstack::Elf::Object,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<pstack::Elf::Object>,pstack::Context&,std::shared_ptr<pstack::Reader_const>>
                  ((__shared_ptr<pstack::Elf::Object,(__gnu_cxx::_Lock_policy)2> *)
                   (exeName.field_2._M_local_buf + 8),
                   (allocator<pstack::Elf::Object> *)
                   ((long)&elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7),local_80,&local_90);
        if (local_90.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_68 != &exeName._M_string_length) {
          operator_delete(local_68,exeName._M_string_length + 1);
        }
        this->vdsoBase = load;
        name._M_str = "(vdso image)";
        name._M_len = 0xc;
        addElfObject(this,name,(sptr *)((long)&exeName.field_2 + 8),load);
        (this->vdsoImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)exeName.field_2._8_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (local_78,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&elf);
        if (1 < *(int *)(this->context + 0xa0)) {
          poVar6 = *(ostream **)(this->context + 0x78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auxv: VDSO ",0xb);
          (**(code **)(**(long **)(exeName.field_2._8_8_ + 0x40) + 0x28))
                    (*(long **)(exeName.field_2._8_8_ + 0x40),poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," loaded at ",0xb);
          *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        }
        if (elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
      }
      idx = idx + 1;
    } while (idx != local_4b8.eof);
  }
  return;
}

Assistant:

void
Process::processAUXV(const Reader &auxio)
{
    for (auto &aux : ReaderArray<Elf::auxv_t>(auxio)) {
        Elf::Addr hdr = aux.a_un.a_val;
        switch (aux.a_type) {
            case AT_NULL: // Indicates end of the AUXV vector.
                return;
            case AT_ENTRY: {
                if (context.verbose > 2)
                    *context.debug << "auxv: AT_ENTRY=" << hdr << std::endl;
                // this provides a reference for relocating the executable when
                // compared to the entrypoint there.
                entry = hdr;
                break;
            }
            case AT_SYSINFO: {
                if (context.verbose > 2)
                    *context.debug << "auxv:AT_SYSINFO=" << hdr << std::endl;
                sysent = hdr;
                break;
            }
            case AT_SYSINFO_EHDR: {
                try {
                    auto elf = std::make_shared<Elf::Object>(context, io->view("(vdso image)", hdr, 65536));
                    vdsoBase = hdr;
                    addElfObject("(vdso image)", elf, hdr);
                    vdsoImage = elf;
                    if (context.verbose >= 2) {
                        *context.debug << "auxv: VDSO " << *elf->io
                            << " loaded at " << std::hex << hdr << std::dec << "\n";
                    }

                }
                catch (const std::exception &ex) {
                    if (context.debug)
                        *context.debug << "auxv: warning: failed to load DSO: " << ex.what() << "\n";
                }
                break;
            }
            case AT_BASE:
                if (context.verbose > 2)
                    *context.debug << "auxv: AT_BASE=" << hdr << std::endl;
                interpBase = hdr;
                break;
#ifdef AT_EXECFN
            case AT_EXECFN: {
                if (context.verbose > 2)
                    *context.debug << "auxv: AT_EXECFN=" << hdr << std::endl;
                try {
                    auto exeName = io->readString(hdr);
                    if (context.verbose >= 2)
                        *context.debug << "filename from auxv: " << exeName << "\n";
                    if (!execImage) {
                        execImage = context.getImageForName(exeName);
                        if (entry == 0)
                            entry = execImage->getHeader().e_entry;
                    }
                }
                catch (const Exception &ex) {
                    *context.debug << "failed to read AT_EXECFN: " << ex.what() << std::endl;
                }

                break;
            }
#endif
            default:
                if (context.verbose > 2)
                    *context.debug << "auxv: " << auxtype2str( aux.a_type) << ": " << hdr << std::endl;
        }
    }
}